

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

int Curl_connect_getsock(connectdata *conn)

{
  HTTP *http;
  connectdata *conn_local;
  
  if ((conn->connect_state->http_proxy).sending == HTTPSEND_REQUEST) {
    conn_local._4_4_ = 0x10000;
  }
  else {
    conn_local._4_4_ = 1;
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_connect_getsock(struct connectdata *conn)
{
  struct HTTP *http;
  DEBUGASSERT(conn);
  DEBUGASSERT(conn->connect_state);
  http = &conn->connect_state->http_proxy;

  if(http->sending == HTTPSEND_REQUEST)
    return GETSOCK_WRITESOCK(0);

  return GETSOCK_READSOCK(0);
}